

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqarray.h
# Opt level: O0

bool __thiscall SQArray::Remove(SQArray *this,SQInteger idx)

{
  SQUnsignedInteger SVar1;
  char *in_RSI;
  SQArray *in_RDI;
  
  if ((-1 < (long)in_RSI) &&
     (SVar1 = sqvector<SQObjectPtr>::size(&in_RDI->_values), (long)in_RSI < (long)SVar1)) {
    sqvector<SQObjectPtr>::remove(&in_RDI->_values,in_RSI);
    ShrinkIfNeeded(in_RDI);
    return true;
  }
  return false;
}

Assistant:

bool Remove(SQInteger idx){
        if(idx < 0 || idx >= (SQInteger)_values.size())
            return false;
        _values.remove(idx);
        ShrinkIfNeeded();
        return true;
    }